

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O3

void __thiscall despot::Adventurer::Adventurer(Adventurer *this,int num_goals)

{
  ulong *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong uVar4;
  string map;
  istringstream iss;
  ulong *local_270;
  long local_268;
  ulong local_260;
  undefined4 uStack_258;
  undefined4 uStack_254;
  ulong *local_250;
  long local_248;
  ulong local_240 [2];
  ulong *local_230;
  long local_228;
  ulong local_220 [2];
  long *local_210;
  undefined8 local_208;
  long local_200;
  undefined8 uStack_1f8;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0 [2];
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0 [2];
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  undefined4 uStack_198;
  undefined4 uStack_194;
  ios_base local_138 [264];
  
  despot::BeliefMDP::BeliefMDP(&this->super_BeliefMDP);
  *(undefined8 *)&this->field_0x30 = 0;
  *(undefined8 *)&this->field_0x38 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined ***)this = &PTR__Adventurer_001139c0;
  *(undefined ***)&this->super_MDP = &PTR__Adventurer_00113af8;
  *(undefined ***)&this->super_StateIndexer = &PTR__Adventurer_00113b48;
  *(undefined ***)&this->super_StatePolicy = &PTR__Adventurer_00113b80;
  (this->trap_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->trap_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->trap_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->goal_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->goal_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->goal_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->goal_reward_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->goal_reward_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->goal_reward_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->states_).
  super__Vector_base<despot::AdventurerState_*,_std::allocator<despot::AdventurerState_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->states_).
  super__Vector_base<despot::AdventurerState_*,_std::allocator<despot::AdventurerState_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->states_).
  super__Vector_base<despot::AdventurerState_*,_std::allocator<despot::AdventurerState_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::AdventurerState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::AdventurerState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::AdventurerState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::AdventurerState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::AdventurerState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::AdventurerState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::AdventurerState_*,_std::allocator<despot::AdventurerState_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::AdventurerState_*,_std::allocator<despot::AdventurerState_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::AdventurerState_*,_std::allocator<despot::AdventurerState_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memory_pool_).num_allocated_ = 0;
  current_ = this;
  if ((num_goals != 2) && (num_goals != 0x32)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[Adventurer::Adventurer] Only 2 or 50 goals are supported.",
               0x3a);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    exit(0);
  }
  local_230 = local_220;
  if (num_goals == 2) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,"mapSize = 5 nGoal = 2\n","");
    local_250 = local_240;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"0.5 0.5 0.5 0.5 0.5\n","")
    ;
    uVar4 = 0xf;
    if (local_230 != local_220) {
      uVar4 = local_220[0];
    }
    if (uVar4 < (ulong)(local_248 + local_228)) {
      uVar4 = 0xf;
      if (local_250 != local_240) {
        uVar4 = local_240[0];
      }
      if (uVar4 < (ulong)(local_248 + local_228)) goto LAB_00108b86;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_230);
    }
    else {
LAB_00108b86:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_250);
    }
    local_270 = &local_260;
    puVar1 = puVar3 + 2;
    if ((ulong *)*puVar3 == puVar1) {
      local_260 = *puVar1;
      uStack_258 = *(undefined4 *)(puVar3 + 3);
      uStack_254 = *(undefined4 *)((long)puVar3 + 0x1c);
    }
    else {
      local_260 = *puVar1;
      local_270 = (ulong *)*puVar3;
    }
    local_268 = puVar3[1];
    *puVar3 = puVar1;
    puVar3[1] = 0;
    *(undefined1 *)puVar1 = 0;
    local_1d0 = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"0.5 101 0.5 150\n","");
    uVar4 = 0xf;
    if (local_270 != &local_260) {
      uVar4 = local_260;
    }
    if (uVar4 < (ulong)(local_1c8 + local_268)) {
      uVar4 = 0xf;
      if (local_1d0 != local_1c0) {
        uVar4 = local_1c0[0];
      }
      if (uVar4 < (ulong)(local_1c8 + local_268)) goto LAB_00108ceb;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_270);
    }
    else {
LAB_00108ceb:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_1d0);
    }
    local_1b0 = &local_1a0;
    puVar1 = puVar3 + 2;
    if ((ulong *)*puVar3 == puVar1) {
      local_1a0 = *puVar1;
      uStack_198 = *(undefined4 *)(puVar3 + 3);
      uStack_194 = *(undefined4 *)((long)puVar3 + 0x1c);
    }
    else {
      local_1a0 = *puVar1;
      local_1b0 = (ulong *)*puVar3;
    }
    local_1a8 = puVar3[1];
    *puVar3 = puVar1;
    puVar3[1] = 0;
    *(undefined1 *)puVar1 = 0;
    local_1f0 = local_1e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"0.3","");
    uVar4 = 0xf;
    if (local_1b0 != &local_1a0) {
      uVar4 = local_1a0;
    }
    if (uVar4 < (ulong)(local_1e8 + local_1a8)) {
      uVar4 = 0xf;
      if (local_1f0 != local_1e0) {
        uVar4 = local_1e0[0];
      }
      if (uVar4 < (ulong)(local_1e8 + local_1a8)) goto LAB_00108ebb;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_1b0);
    }
    else {
LAB_00108ebb:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_1f0);
    }
    local_210 = &local_200;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_200 = *plVar2;
      uStack_1f8 = puVar3[3];
    }
    else {
      local_200 = *plVar2;
      local_210 = (long *)*puVar3;
    }
    local_208 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)plVar2 = 0;
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0,local_1e0[0] + 1);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0,local_1a0 + 1);
    }
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,local_1c0[0] + 1);
    }
    if (local_270 != &local_260) {
      operator_delete(local_270,local_260 + 1);
    }
    if (local_250 != local_240) {
      operator_delete(local_250,local_240[0] + 1);
    }
    if (local_230 == local_220) goto LAB_001091b0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,"mapSize = 5 nGoal = 50\n","");
    local_250 = local_240;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"0.5 0.5 0.5 0.5 0.5\n","")
    ;
    uVar4 = 0xf;
    if (local_230 != local_220) {
      uVar4 = local_220[0];
    }
    if (uVar4 < (ulong)(local_248 + local_228)) {
      uVar4 = 0xf;
      if (local_250 != local_240) {
        uVar4 = local_240[0];
      }
      if (uVar4 < (ulong)(local_248 + local_228)) goto LAB_00108c10;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_230);
    }
    else {
LAB_00108c10:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_250);
    }
    local_270 = &local_260;
    puVar1 = puVar3 + 2;
    if ((ulong *)*puVar3 == puVar1) {
      local_260 = *puVar1;
      uStack_258 = *(undefined4 *)(puVar3 + 3);
      uStack_254 = *(undefined4 *)((long)puVar3 + 0x1c);
    }
    else {
      local_260 = *puVar1;
      local_270 = (ulong *)*puVar3;
    }
    local_268 = puVar3[1];
    *puVar3 = puVar1;
    puVar3[1] = 0;
    *(undefined1 *)puVar1 = 0;
    local_1d0 = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d0,
               "0.02 101 0.02 102 0.02 103 0.02 104 0.02 105 0.02 106 0.02 107 0.02 108 0.02 109 0.02 110 0.02 111 0.02 112 0.02 113 0.02 114 0.02 115 0.02 116 0.02 117 0.02 118 0.02 119 0.02 120 0.02 121 0.02 122 0.02 123 0.02 124 0.02 125 0.02 126 0.02 127 0.02 128 0.02 129 0.02 130 0.02 131 0.02 132 0.02 133 0.02 134 0.02 135 0.02 136 0.02 137 0.02 138 0.02 139 0.02 140 0.02 141 0.02 142 0.02 143 0.02 144 0.02 145 0.02 146 0.02 147 0.02 148 0.02 149 0.02 150\n"
               ,"");
    uVar4 = 0xf;
    if (local_270 != &local_260) {
      uVar4 = local_260;
    }
    if (uVar4 < (ulong)(local_1c8 + local_268)) {
      uVar4 = 0xf;
      if (local_1d0 != local_1c0) {
        uVar4 = local_1c0[0];
      }
      if (uVar4 < (ulong)(local_1c8 + local_268)) goto LAB_00108dc9;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_270);
    }
    else {
LAB_00108dc9:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_1d0);
    }
    local_1b0 = &local_1a0;
    puVar1 = puVar3 + 2;
    if ((ulong *)*puVar3 == puVar1) {
      local_1a0 = *puVar1;
      uStack_198 = *(undefined4 *)(puVar3 + 3);
      uStack_194 = *(undefined4 *)((long)puVar3 + 0x1c);
    }
    else {
      local_1a0 = *puVar1;
      local_1b0 = (ulong *)*puVar3;
    }
    local_1a8 = puVar3[1];
    *puVar3 = puVar1;
    puVar3[1] = 0;
    *(undefined1 *)puVar1 = 0;
    local_1f0 = local_1e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"0.3","");
    uVar4 = 0xf;
    if (local_1b0 != &local_1a0) {
      uVar4 = local_1a0;
    }
    if (uVar4 < (ulong)(local_1e8 + local_1a8)) {
      uVar4 = 0xf;
      if (local_1f0 != local_1e0) {
        uVar4 = local_1e0[0];
      }
      if (uVar4 < (ulong)(local_1e8 + local_1a8)) goto LAB_00108fb0;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_1b0);
    }
    else {
LAB_00108fb0:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_1f0);
    }
    local_210 = &local_200;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_200 = *plVar2;
      uStack_1f8 = puVar3[3];
    }
    else {
      local_200 = *plVar2;
      local_210 = (long *)*puVar3;
    }
    local_208 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)plVar2 = 0;
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0,local_1e0[0] + 1);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0,local_1a0 + 1);
    }
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,local_1c0[0] + 1);
    }
    if (local_270 != &local_260) {
      operator_delete(local_270,local_260 + 1);
    }
    if (local_250 != local_240) {
      operator_delete(local_250,local_240[0] + 1);
    }
    if (local_230 == local_220) goto LAB_001091b0;
  }
  operator_delete(local_230,local_220[0] + 1);
LAB_001091b0:
  std::__cxx11::istringstream::istringstream((istringstream *)&local_1b0,(string *)&local_210,_S_in)
  ;
  Init(this,(istream *)&local_1b0);
  std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
  std::ios_base::~ios_base(local_138);
  if (local_210 != &local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  return;
}

Assistant:

Adventurer::Adventurer(int num_goals) {
	current_ = this;

	if (num_goals != 2 && num_goals != 50) {
		cerr << "[Adventurer::Adventurer] Only 2 or 50 goals are supported." << endl;
		exit(0);
	}

	string map =
		num_goals == 2 ?
		(string("mapSize = 5 nGoal = 2\n")
			+ string("0.5 0.5 0.5 0.5 0.5\n") // probabilities of being trapped
			+ string("0.5 101 0.5 150\n") // goal probability, goal reward
			+ string("0.3") // observation noise
		)
		:
		(string("mapSize = 5 nGoal = 50\n")
			+ string("0.5 0.5 0.5 0.5 0.5\n") // probabilities of being trapped
			+ string("0.02 101 0.02 102 0.02 103 0.02 104 0.02 105 0.02 106 0.02 107 0.02 108 0.02 109 0.02 110 0.02 111 0.02 112 0.02 113 0.02 114 0.02 115 0.02 116 0.02 117 0.02 118 0.02 119 0.02 120 0.02 121 0.02 122 0.02 123 0.02 124 0.02 125 0.02 126 0.02 127 0.02 128 0.02 129 0.02 130 0.02 131 0.02 132 0.02 133 0.02 134 0.02 135 0.02 136 0.02 137 0.02 138 0.02 139 0.02 140 0.02 141 0.02 142 0.02 143 0.02 144 0.02 145 0.02 146 0.02 147 0.02 148 0.02 149 0.02 150\n")  // goal probability, goal reward
			+ string("0.3") // observation noise
		);

	istringstream iss(map);
	Init(iss);
	// PrintPOMDPX();
}